

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_ep_set_recvmaxsz(void *arg,void *v,size_t sz,nni_opt_type t)

{
  int iVar1;
  ulong uStack_40;
  int rv;
  size_t val;
  udp_ep *ep;
  size_t sStack_28;
  nni_opt_type t_local;
  size_t sz_local;
  void *v_local;
  void *arg_local;
  
  val = (size_t)arg;
  ep._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)v;
  v_local = arg;
  iVar1 = nni_copyin_size(&stack0xffffffffffffffc0,v,sz,0,65000,t);
  arg_local._4_4_ = iVar1;
  if (iVar1 == 0) {
    if ((uStack_40 == 0) || (65000 < uStack_40)) {
      uStack_40 = 65000;
    }
    nni_mtx_lock((nni_mtx *)(val + 8));
    if ((*(byte *)(val + 0x35) & 1) == 0) {
      *(short *)(val + 0xa30) = (short)uStack_40;
      nni_mtx_unlock((nni_mtx *)(val + 8));
      nni_stat_set_value((nni_stat_item *)(val + 0xa78),uStack_40);
    }
    else {
      nni_mtx_unlock((nni_mtx *)(val + 8));
      arg_local._4_4_ = 4;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
udp_ep_set_recvmaxsz(void *arg, const void *v, size_t sz, nni_opt_type t)
{
	udp_ep *ep = arg;
	size_t  val;
	int     rv;
	if ((rv = nni_copyin_size(&val, v, sz, 0, 65000, t)) == 0) {
		if ((val == 0) || (val > 65000)) {
			val = 65000;
		}
		nni_mtx_lock(&ep->mtx);
		if (ep->started) {
			nni_mtx_unlock(&ep->mtx);
			return (NNG_EBUSY);
		}
		ep->rcvmax = (uint16_t) val;
		nni_mtx_unlock(&ep->mtx);
		nni_stat_set_value(&ep->st_rcv_max, val);
	}
	return (rv);
}